

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O1

vector<long_long,_std::allocator<long_long>_> *
hiberlite::Database::dbSelectIds
          (vector<long_long,_std::allocator<long_long>_> *__return_storage_ptr__,
          shared_connection *con,string *table,string *condition,string *orderBy)

{
  int *piVar1;
  iterator __position;
  bool bVar2;
  long *plVar3;
  long *plVar4;
  SQLiteSelect sel;
  string query;
  string order;
  string where;
  shared_connection local_190;
  SQLiteSelect local_180;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [16];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_b0 = local_a0;
  local_a8 = 0;
  local_a0[0] = 0;
  if (condition->_M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_180,
                   " WHERE ",condition);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_180);
    if ((shared_stmt *)local_180._vptr_SQLiteSelect != &local_180.statement) {
      operator_delete(local_180._vptr_SQLiteSelect);
    }
  }
  local_d0 = local_c0;
  local_c8 = 0;
  local_c0[0] = 0;
  if (orderBy->_M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_180,
                   " ORDER BY ",orderBy);
    std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_180);
    if ((shared_stmt *)local_180._vptr_SQLiteSelect != &local_180.statement) {
      operator_delete(local_180._vptr_SQLiteSelect);
    }
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"hiberlite_id","");
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1a69ed);
  local_130 = &local_120;
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_120 = *plVar4;
    lStack_118 = plVar3[3];
  }
  else {
    local_120 = *plVar4;
    local_130 = (long *)*plVar3;
  }
  local_128 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_130);
  local_110 = &local_100;
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_100 = *plVar4;
    lStack_f8 = plVar3[3];
  }
  else {
    local_100 = *plVar4;
    local_110 = (long *)*plVar3;
  }
  local_108 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_110,(ulong)(table->_M_dataplus)._M_p);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_80 = *plVar4;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar4;
    local_90 = (long *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_e0 = *plVar4;
    lStack_d8 = plVar3[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar4;
    local_f0 = (long *)*plVar3;
  }
  local_e8 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_d0);
  plVar4 = plVar3 + 2;
  if ((shared_stmt *)*plVar3 == (shared_stmt *)plVar4) {
    local_180.statement._vptr_shared_res = (_func_int **)*plVar4;
    local_180.statement.res = (shared_cnt_obj_pair<hiberlite::statement_ptr> *)plVar3[3];
    local_180._vptr_SQLiteSelect = (_func_int **)&local_180.statement;
  }
  else {
    local_180.statement._vptr_shared_res = (_func_int **)*plVar4;
    local_180._vptr_SQLiteSelect = (_func_int **)*plVar3;
  }
  local_180._8_8_ = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_180);
  local_150 = &local_140;
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_140 = *plVar4;
    lStack_138 = plVar3[3];
  }
  else {
    local_140 = *plVar4;
    local_150 = (long *)*plVar3;
  }
  local_148 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((shared_stmt *)local_180._vptr_SQLiteSelect != &local_180.statement) {
    operator_delete(local_180._vptr_SQLiteSelect);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  local_190._vptr_shared_res = (_func_int **)&PTR__shared_res_001d4578;
  local_190.res = con->res;
  if (local_190.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_190.res)->refCount = (local_190.res)->refCount + 1;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_150,local_148 + (long)local_150);
  SQLiteSelect::SQLiteSelect(&local_180,&local_190,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_190._vptr_shared_res = (_func_int **)&PTR__shared_res_001d4578;
  if (local_190.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar1 = &(local_190.res)->refCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_190.res)->_vptr_shared_cnt_obj_pair[1])();
    }
  }
  (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    bVar2 = SQLiteSelect::step(&local_180);
    if (!bVar2) break;
    local_f0 = (long *)SQLiteSelect::get_int64(&local_180,0);
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                (__return_storage_ptr__,__position,(longlong *)&local_f0);
    }
    else {
      *__position._M_current = (longlong)local_f0;
      (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  SQLiteSelect::~SQLiteSelect(&local_180);
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<sqlid_t> Database::dbSelectIds(shared_connection con, const std::string table, const std::string condition, const std::string orderBy)
{
	std::string where;
	if(condition.size())
		where=" WHERE "+condition;
	std::string order;
	if(orderBy.size())
		order=" ORDER BY "+orderBy;
	std::string query="SELECT "+std::string(HIBERLITE_PRIMARY_KEY_COLUMN)
			+" FROM "+table
			+where
			+order
			+";";
	SQLiteSelect sel(con, query);
	std::vector<sqlid_t> ans;
	while(sel.step())
		ans.push_back( sel.get_int64(0) );
	return ans;
}